

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

void __thiscall
nigel::IMC_Generator::generateSetAfterOp
          (IMC_Generator *this,OperationCombination comb,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::Token> *lValToken)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **in_stack_ffffffffffffff08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  shared_ptr<nigel::IM_Operator> local_38;
  
  if (comb < cv) {
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xffffffffffffff08);
    iVar1 = *(int *)((long)in_stack_ffffffffffffff08 + 0x1c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
    if (iVar1 == 0) {
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,&lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)
      ;
      local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_adr_a,(shared_ptr<nigel::IM_Operator> *)&local_58,&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_00 = &local_58._M_refcount;
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xffffffffffffff08);
      iVar1 = *(int *)((long)in_stack_ffffffffffffff08 + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
      if (iVar1 == 1) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_68,&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
        local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_dptr_a,&local_b8,&local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_00 = &local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xffffffffffffff08);
        iVar1 = *(int *)((long)in_stack_ffffffffffffff08 + 0x1c);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        IM_SFR::getSFR((SFR)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_f0._M_pi;
        _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_adr_a,&local_38,&local_d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_78,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
        IM_SFR::getSFR(0);
        this_00 = &_Stack_f0;
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_f0._M_pi;
        _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_atr0_adr,&local_48,&local_e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
  }
  else {
    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,&lValToken->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,err_cannotSetAConstantLiteral,
               (shared_ptr<nigel::Token> *)&local_88);
    this_00 = &local_88._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return;
}

Assistant:

void IMC_Generator::generateSetAfterOp( OperationCombination comb, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<Token> lValToken )
	{
		if( comb == OC::vv || comb == OC::vc || comb == OC::vt )
		{//Is the same, because after a operation the value will be located in the acc.
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_a, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_dptr_a );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::SW ) );
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_atr0_adr, IM_SFR::getSFR( IM_SFR::SFR::SW ) );
			}
		}
		else generateNotification( NT::err_cannotSetAConstantLiteral, lValToken );
	}